

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

bool ExecuteCommands(vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *commands,
                    JSONRPCRequest *request,UniValue *result)

{
  string *method;
  long lVar1;
  pointer pbVar2;
  pointer ppVar3;
  UniValue *pUVar4;
  string str;
  string str_00;
  string key;
  string str_01;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  bool bVar5;
  pointer ppCVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
  __it;
  UniValue *pUVar9;
  UniValue *pUVar10;
  pointer __k;
  string *key_00;
  char in_R8B;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  pointer ppVar15;
  pointer ppCVar16;
  long in_FS_OFFSET;
  string_view str_02;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_false,_true>,_bool>
  pVar17;
  undefined4 in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  pointer in_stack_fffffffffffffab8;
  CRPCCommand *pCVar18;
  pointer ppCVar19;
  vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *pvVar20;
  JSONRPCRequest *pJVar21;
  pointer ppCVar22;
  pointer this;
  UniValue *pUVar23;
  RPCCommandExecution execution;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vargNames;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>_>
  argsIn;
  JSONRPCRequest local_498;
  UniValue local_340;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8 [16];
  UniValue named_args;
  UniValue local_270;
  UniValue local_218;
  node_type positional_args;
  UniValue local_1a0;
  UniValue local_148;
  string local_f0 [32];
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  UniValue options;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar6 = (commands->super__Vector_base<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppCVar19 = (commands->
             super__Vector_base<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  method = &request->strMethod;
  pUVar10 = &local_498.params;
  pvVar20 = commands;
  pJVar21 = request;
  this = &request->params;
  do {
    ppCVar16 = ppCVar6;
    if (ppCVar6 == ppCVar19) break;
    pCVar18 = *ppCVar6;
    ppCVar22 = (commands->
               super__Vector_base<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    pUVar23 = this;
    RPCCommandExecution::RPCCommandExecution(&execution,method);
    ppCVar22 = ppCVar22 + -1;
    if (this->typ == VOBJ) {
      JSONRPCRequest::JSONRPCRequest(&local_498,request);
      local_b0 = local_a0;
      local_a8 = 0;
      local_a0[0] = 0;
      str._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffaac;
      str._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffaa8;
      str._M_string_length = (size_type)pUVar10;
      str.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffab8;
      str.field_2._8_8_ = pCVar18;
      UniValue::UniValue(&options,VARR,str);
      UniValue::operator=(pUVar10,&options);
      UniValue::~UniValue(&options);
      std::__cxx11::string::~string((string *)&local_b0);
      pvVar7 = UniValue::getKeys_abi_cxx11_(this);
      pvVar8 = UniValue::getValues(this);
      argsIn._M_h._M_buckets = &argsIn._M_h._M_single_bucket;
      argsIn._M_h._M_bucket_count = 1;
      argsIn._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      argsIn._M_h._M_element_count = 0;
      argsIn._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      argsIn._M_h._M_rehash_policy._M_next_resize = 0;
      argsIn._M_h._M_single_bucket = (__node_base_ptr)0x0;
      lVar13 = 0;
      lVar14 = 0;
      pUVar9 = pUVar10;
      commands = pvVar20;
      request = pJVar21;
      for (uVar11 = 0;
          pbVar2 = (pvVar7->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar11 < (ulong)((long)(pvVar7->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
          uVar11 = uVar11 + 1) {
        options._0_8_ =
             (long)&((pvVar8->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                     super__Vector_impl_data._M_start)->typ + lVar13;
        pVar17 = std::
                 _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,UniValue_const*>,std::allocator<std::pair<std::__cxx11::string_const,UniValue_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::__cxx11::string_const&,UniValue_const*>
                           ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,UniValue_const*>,std::allocator<std::pair<std::__cxx11::string_const,UniValue_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)&argsIn,(long)&(pbVar2->_M_dataplus)._M_p + lVar14,&options);
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pUVar10 = (UniValue *)__cxa_allocate_exception(0x58);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_148,"Parameter ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&(((pvVar7->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar14));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &options,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_148," specified multiple times");
          JSONRPCError(pUVar10,-8,(string *)&options);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(pUVar10,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00883dca;
        }
        lVar14 = lVar14 + 0x20;
        lVar13 = lVar13 + 0x58;
      }
      local_d0 = local_c0;
      local_c8 = 0;
      local_c0[0] = 0;
      str_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffaac;
      str_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffaa8;
      str_00._M_string_length = (size_type)pUVar9;
      str_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffab8;
      str_00.field_2._8_8_ = pCVar18;
      UniValue::UniValue(&options,VOBJ,str_00);
      std::__cxx11::string::~string((string *)&local_d0);
      ppVar3 = (pCVar18->argNames).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      in_stack_fffffffffffffab8 = (pointer)0x0;
      in_stack_fffffffffffffaac = 0;
      iVar12 = 0;
      for (ppVar15 = (pCVar18->argNames).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar3;
          ppVar15 = ppVar15 + 1) {
        str_02._M_str = (char *)0x7c;
        str_02._M_len = (size_t)(ppVar15->first)._M_dataplus._M_p;
        util::SplitString_abi_cxx11_
                  (&vargNames,(util *)(ppVar15->first)._M_string_length,str_02,in_R8B);
        pbVar2 = vargNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        __k = vargNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (__k == pbVar2) {
            if (ppVar15->second != false) goto LAB_00883483;
            __it._M_cur = (__node_type *)0x0;
            goto LAB_008832d1;
          }
          __it._M_cur = (__node_type *)
                        std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(&argsIn._M_h,__k);
          __k = __k + 1;
        } while (__it._M_cur == (__node_type *)0x0);
        if (ppVar15->second == false) {
LAB_008832d1:
          if ((options.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_finish ==
               options.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start) && (__it._M_cur == (__node_type *)0x0)) {
            iVar12 = iVar12 + 1;
            if (local_498.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_498.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              in_stack_fffffffffffffaac = iVar12;
            }
          }
          else {
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            while (bVar5 = iVar12 != 0, iVar12 = iVar12 + -1, bVar5) {
              local_1a0.val._M_string_length = 0;
              local_1a0.val.field_2._M_local_buf[0] = '\0';
              local_1a0.typ = VNULL;
              local_1a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_1a0.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_1a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_1a0.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1a0.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              val._4_4_ = in_stack_fffffffffffffaac;
              val.typ = in_stack_fffffffffffffaa8;
              val.val._M_dataplus._M_p = (pointer)pUVar9;
              val.val._M_string_length = (size_type)in_stack_fffffffffffffab8;
              val.val.field_2._M_allocated_capacity = (size_type)pCVar18;
              val.val.field_2._8_8_ = result;
              val.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)ppCVar19;
              val.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)commands;
              val.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)request;
              val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppCVar22;
              val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)ppCVar6;
              val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = pUVar23;
              local_1a0.val._M_dataplus._M_p = (pointer)&local_1a0.val.field_2;
              UniValue::push_back(pUVar9,val);
              UniValue::~UniValue(&local_1a0);
            }
            if (in_stack_fffffffffffffab8 == (pointer)0x0) {
              in_stack_fffffffffffffab8 = ppVar15;
            }
            if (__it._M_cur != (__node_type *)0x0) {
              if (options.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  options.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                pUVar10 = (UniValue *)__cxa_allocate_exception(0x58);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &positional_args,"Parameter ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &(__it._M_cur)->
                                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                              );
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_340,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &positional_args," conflicts with parameter ");
                pvVar7 = UniValue::getKeys_abi_cxx11_(&options);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &named_args,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_340,
                               (pvVar7->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
                JSONRPCError(pUVar10,-8,(string *)&named_args);
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                  __cxa_throw(pUVar10,&UniValue::typeinfo,UniValue::~UniValue);
                }
                goto LAB_00883dca;
              }
              UniValue::UniValue(&local_218,
                                 *(UniValue **)
                                  ((long)&((__it._M_cur)->
                                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                                          ).
                                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>
                                          ._M_storage._M_storage + 0x20));
              val_00._4_4_ = in_stack_fffffffffffffaac;
              val_00.typ = in_stack_fffffffffffffaa8;
              val_00.val._M_dataplus._M_p = (pointer)pUVar9;
              val_00.val._M_string_length = (size_type)in_stack_fffffffffffffab8;
              val_00.val.field_2._M_allocated_capacity = (size_type)pCVar18;
              val_00.val.field_2._8_8_ = result;
              val_00.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)ppCVar19;
              val_00.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)commands;
              val_00.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)request;
              val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppCVar22;
              val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)ppCVar6;
              val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = pUVar23;
              UniValue::push_back(pUVar9,val_00);
              UniValue::~UniValue(&local_218);
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::erase(&argsIn._M_h,(const_iterator)__it._M_cur);
            }
            iVar12 = 0;
            if (options.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                options.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start) {
              UniValue::UniValue(&local_270,&options);
              val_01._4_4_ = in_stack_fffffffffffffaac;
              val_01.typ = in_stack_fffffffffffffaa8;
              val_01.val._M_dataplus._M_p = (pointer)pUVar9;
              val_01.val._M_string_length = (size_type)in_stack_fffffffffffffab8;
              val_01.val.field_2._M_allocated_capacity = (size_type)pCVar18;
              val_01.val.field_2._8_8_ = result;
              val_01.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)ppCVar19;
              val_01.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)commands;
              val_01.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)request;
              val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppCVar22;
              val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)ppCVar6;
              val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = pUVar23;
              UniValue::push_back(pUVar9,val_01);
              UniValue::~UniValue(&local_270);
              local_2e8 = local_2d8;
              local_2e0 = 0;
              local_2d8[0] = 0;
              str_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffaac;
              str_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffaa8;
              str_01._M_string_length = (size_type)pUVar9;
              str_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffab8;
              str_01.field_2._8_8_ = pCVar18;
              UniValue::UniValue(&named_args,VOBJ,str_01);
              UniValue::operator=(&options,&named_args);
              UniValue::~UniValue(&named_args);
              std::__cxx11::string::~string((string *)&local_2e8);
            }
          }
        }
        else {
          key_00 = (string *)((long)__it._M_cur + 8);
          bVar5 = UniValue::exists(&options,key_00);
          if (bVar5) {
            pUVar10 = (UniValue *)__cxa_allocate_exception(0x58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_340,"Parameter ",key_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &named_args,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_340," specified multiple times");
            JSONRPCError(pUVar10,-8,(string *)&named_args);
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(pUVar10,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_00883dca;
          }
          std::__cxx11::string::string(local_f0,key_00);
          UniValue::UniValue(&local_148,*(UniValue **)((long)__it._M_cur + 0x28));
          key._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffaac;
          key._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffaa8;
          key._M_string_length = (size_type)pUVar9;
          key.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffab8;
          key.field_2._8_8_ = pCVar18;
          val_03.val._M_dataplus._M_p = (pointer)ppCVar19;
          val_03._0_8_ = result;
          val_03.val._M_string_length = (size_type)commands;
          val_03.val.field_2._M_allocated_capacity = (size_type)request;
          val_03.val.field_2._8_8_ = ppCVar22;
          val_03.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppCVar6;
          val_03.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar23;
          val_03.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = method;
          val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)ppVar3;
          val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)execution.it._M_node;
          val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)vargNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          UniValue::pushKVEnd(&options,key,val_03);
          UniValue::~UniValue(&local_148);
          std::__cxx11::string::~string(local_f0);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::erase(&argsIn._M_h,(const_iterator)__it._M_cur);
        }
LAB_00883483:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vargNames);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&named_args,"args",(allocator<char> *)&local_340);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::extract(&positional_args,&argsIn._M_h,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&named_args);
      pvVar20 = commands;
      pJVar21 = request;
      std::__cxx11::string::~string((string *)&named_args);
      pUVar10 = pUVar9;
      if ((positional_args.
           super__Node_handle_common<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>_>_>
           ._M_ptr != (pointer)0x0) && (pUVar4 = *positional_args._M_pmapped, pUVar4->typ == VARR))
      {
        if ((in_stack_fffffffffffffaac <
             (int)(((long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x58)) &&
           (in_stack_fffffffffffffab8 != (pointer)0x0)) {
          pUVar10 = (UniValue *)__cxa_allocate_exception(0x58);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_340,"Parameter ",&in_stack_fffffffffffffab8->first);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &named_args,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_340," specified twice both as positional and named argument");
          JSONRPCError(pUVar10,-8,(string *)&named_args);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(pUVar10,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00883dca;
        }
        UniValue::UniValue(&named_args,pUVar9);
        UniValue::operator=(pUVar9,*positional_args._M_pmapped);
        for (uVar11 = ((long)local_498.params.values.
                             super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_498.params.values.
                            super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x58;
            uVar11 < (ulong)(((long)named_args.values.
                                    super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)named_args.values.
                                   super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                   super__Vector_impl_data._M_start) / 0x58); uVar11 = uVar11 + 1) {
          pUVar9 = UniValue::operator[](&named_args,uVar11);
          UniValue::UniValue(&local_340,pUVar9);
          val_02._4_4_ = in_stack_fffffffffffffaac;
          val_02.typ = in_stack_fffffffffffffaa8;
          val_02.val._M_dataplus._M_p = (pointer)pUVar10;
          val_02.val._M_string_length = (size_type)in_stack_fffffffffffffab8;
          val_02.val.field_2._M_allocated_capacity = (size_type)pCVar18;
          val_02.val.field_2._8_8_ = result;
          val_02.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppCVar19;
          val_02.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pvVar20;
          val_02.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pJVar21;
          val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)ppCVar22;
          val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)ppCVar6;
          val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pUVar23;
          UniValue::push_back(pUVar10,val_02);
          UniValue::~UniValue(&local_340);
        }
        UniValue::~UniValue(&named_args);
      }
      if (argsIn._M_h._M_element_count != 0) {
        pUVar10 = (UniValue *)__cxa_allocate_exception(0x58);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &named_args,"Unknown named parameter ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (argsIn._M_h._M_before_begin._M_nxt + 1));
        JSONRPCError(pUVar10,-8,(string *)&named_args);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pUVar10,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00883dca;
      }
      std::
      _Node_handle_common<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>_>_>
      ::~_Node_handle_common
                (&positional_args.
                  super__Node_handle_common<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>_>_>
                );
      UniValue::~UniValue(&options);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&argsIn._M_h);
      bVar5 = std::function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)>::operator()
                        (&pCVar18->actor,&local_498,result,ppCVar6 == ppCVar22);
      JSONRPCRequest::~JSONRPCRequest(&local_498);
      ppCVar16 = ppCVar6;
    }
    else {
      bVar5 = std::function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)>::operator()
                        (&pCVar18->actor,request,result,ppCVar6 == ppCVar22);
    }
    RPCCommandExecution::~RPCCommandExecution(&execution);
    ppCVar6 = ppCVar16 + 1;
    this = pUVar23;
  } while (bVar5 == false);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ppCVar16 != ppCVar19;
  }
LAB_00883dca:
  __stack_chk_fail();
}

Assistant:

static bool ExecuteCommands(const std::vector<const CRPCCommand*>& commands, const JSONRPCRequest& request, UniValue& result)
{
    for (const auto& command : commands) {
        if (ExecuteCommand(*command, request, result, &command == &commands.back())) {
            return true;
        }
    }
    return false;
}